

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDarLcorrNew(Abc_Ntk_t *pNtk,int nVarsMax,int nConfMax,int fVerbose)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAig;
  Aig_Man_t *p;
  Abc_Obj_t *pObj_00;
  int local_fc;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkAig;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Ssw_Pars_t *pPars;
  Ssw_Pars_t Pars;
  int fVerbose_local;
  int nConfMax_local;
  int nVarsMax_local;
  Abc_Ntk_t *pNtk_local;
  
  pObj = (Abc_Obj_t *)0x0;
  Pars.pFunc._4_4_ = fVerbose;
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    Ssw_ManSetDefaultParams((Ssw_Pars_t *)&pPars);
    Pars.fEquivDump2 = 1;
    Pars.fScorrGia = Pars.pFunc._4_4_;
    Pars.fMergeFull = nConfMax;
    Pars.fStopWhenGone = nVarsMax;
    p = Ssw_SignalCorrespondence(pAig,(Ssw_Pars_t *)&pPars);
    Aig_ManStop(pAig);
    if (p != (Aig_Man_t *)0x0) {
      iVar1 = Aig_ManRegNum(p);
      iVar2 = Abc_NtkLatchNum(pNtk);
      if (iVar1 < iVar2) {
        pObj = (Abc_Obj_t *)Abc_NtkFromDarSeqSweep(pNtk,p);
      }
      else {
        pObj = (Abc_Obj_t *)Abc_NtkFromDar(pNtk,p);
        for (local_fc = 0; iVar1 = Vec_PtrSize(((Abc_Ntk_t *)pObj)->vBoxes), local_fc < iVar1;
            local_fc = local_fc + 1) {
          pObj_00 = Abc_NtkBox((Abc_Ntk_t *)pObj,local_fc);
          iVar1 = Abc_ObjIsLatch(pObj_00);
          if (iVar1 != 0) {
            Abc_LatchSetInit0(pObj_00);
          }
        }
      }
      Aig_ManStop(p);
    }
    pNtk_local = (Abc_Ntk_t *)pObj;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarLcorrNew( Abc_Ntk_t * pNtk, int nVarsMax, int nConfMax, int fVerbose )
{
    Ssw_Pars_t Pars, * pPars = &Pars;
    Aig_Man_t * pMan, * pTemp;
    Abc_Ntk_t * pNtkAig = NULL;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    Ssw_ManSetDefaultParams( pPars );
    pPars->fLatchCorrOpt = 1;
    pPars->nBTLimit      = nConfMax;
    pPars->nSatVarMax    = nVarsMax;
    pPars->fVerbose      = fVerbose;
    pMan = Ssw_SignalCorrespondence( pTemp = pMan, pPars );
    Aig_ManStop( pTemp );
    if ( pMan )
    {
        if ( Aig_ManRegNum(pMan) < Abc_NtkLatchNum(pNtk) )
            pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
        else
        {
            Abc_Obj_t * pObj;
            int i;
            pNtkAig = Abc_NtkFromDar( pNtk, pMan );
            Abc_NtkForEachLatch( pNtkAig, pObj, i )
                Abc_LatchSetInit0( pObj );
        }
        Aig_ManStop( pMan );
    }
    return pNtkAig;
}